

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

bool cellClipTest(QTextTable *table,QTextTableData *td,PaintContext *cell_context,
                 QTextTableCell *cell,QRectF cellRect)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  long in_RDX;
  QTextTableCell *in_RSI;
  QTextTableData *in_RDI;
  long in_FS_OFFSET;
  qreal xp2;
  qreal border;
  Edge edge;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  double local_88;
  double local_68;
  double local_48;
  double local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QRectF::isValid((QRectF *)(in_RDX + 0x18));
  edge = (Edge)((ulong)in_RDX >> 0x20);
  if (bVar2) {
    if ((in_RSI[0x14].fragment & 1) == 0) {
      xp2 = QFixed::toReal((QFixed *)&in_RSI[2].fragment);
      QRectF::adjust((QRectF *)&stack0x00000008,-xp2,-xp2,xp2,xp2);
    }
    else {
      axisEdgeData((QTextTable *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                   in_RDI,in_RSI,edge);
      axisEdgeData((QTextTable *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                   in_RDI,in_RSI,edge);
      axisEdgeData((QTextTable *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                   in_RDI,in_RSI,edge);
      axisEdgeData((QTextTable *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                   in_RDI,in_RSI,edge);
      QRectF::adjust((QRectF *)&stack0x00000008,-local_28 / 2.0,-local_48 / 2.0,local_68 / 2.0,
                     local_88 / 2.0);
      EdgeData::~EdgeData((EdgeData *)0x7fbec0);
      EdgeData::~EdgeData((EdgeData *)0x7fbecd);
      EdgeData::~EdgeData((EdgeData *)0x7fbeda);
      EdgeData::~EdgeData((EdgeData *)0x7fbee7);
    }
    uVar3 = QRectF::intersects((QRectF *)&stack0x00000008);
    if ((uVar3 & 1) == 0) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool cellClipTest(QTextTable *table, QTextTableData *td,
                         const QAbstractTextDocumentLayout::PaintContext &cell_context,
                         const QTextTableCell &cell,
                         QRectF cellRect)
{
#ifdef QT_NO_CSSPARSER
    Q_UNUSED(table);
    Q_UNUSED(cell);
#endif

    if (!cell_context.clip.isValid())
        return false;

    if (td->borderCollapse) {
        // we need to account for the cell borders in the clipping test
#ifndef QT_NO_CSSPARSER
        cellRect.adjust(-axisEdgeData(table, td, cell, QCss::LeftEdge).width / 2,
                        -axisEdgeData(table, td, cell, QCss::TopEdge).width / 2,
                        axisEdgeData(table, td, cell, QCss::RightEdge).width / 2,
                        axisEdgeData(table, td, cell, QCss::BottomEdge).width / 2);
#endif
    } else {
        qreal border = td->border.toReal();
        cellRect.adjust(-border, -border, border, border);
    }

    if (!cellRect.intersects(cell_context.clip))
        return true;

    return false;
}